

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O3

void __thiscall kratos::StatementGraph::add_stmt_child(StatementGraph *this,Stmt *stmt)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  iterator iVar3;
  undefined4 extraout_var_00;
  StmtException *pSVar4;
  pointer pcVar5;
  long lVar6;
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  Stmt *local_b8;
  Stmt *local_b0;
  _Rb_tree<kratos::StmtNode*,kratos::StmtNode*,std::_Identity<kratos::StmtNode*>,std::less<kratos::StmtNode*>,std::allocator<kratos::StmtNode*>>
  *local_a8;
  StmtNode *local_a0;
  mapped_type *node;
  undefined1 local_88 [24];
  _Rb_tree_node_base _Stack_70;
  undefined8 local_50;
  Stmt *local_48;
  Stmt *stmt_local;
  Stmt *s;
  
  local_48 = stmt;
  iVar1 = (*(stmt->super_IRNode)._vptr_IRNode[1])(stmt);
  iVar3 = std::
          _Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_48);
  if (iVar3.super__Node_iterator_base<std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_false>.
      _M_cur == (__node_type *)0x0) {
    pcVar5 = (pointer)0x0;
  }
  else {
    iVar3 = std::
            _Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)this,&local_48);
    if (iVar3.super__Node_iterator_base<std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_false>.
        _M_cur == (__node_type *)0x0) {
      std::__throw_out_of_range("_Map_base::at");
    }
    pcVar5 = (pointer)((long)iVar3.
                             super__Node_iterator_base<std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_false>
                             ._M_cur + 0x10);
  }
  if (CONCAT44(extraout_var,iVar1) != 0) {
    local_a8 = (_Rb_tree<kratos::StmtNode*,kratos::StmtNode*,std::_Identity<kratos::StmtNode*>,std::less<kratos::StmtNode*>,std::allocator<kratos::StmtNode*>>
                *)(pcVar5 + 0x10);
    lVar6 = 0;
    do {
      iVar2 = (*(local_48->super_IRNode)._vptr_IRNode[2])(local_48,lVar6);
      if (*(int *)(CONCAT44(extraout_var_00,iVar2) + 0x48) == 2) {
        stmt_local = (Stmt *)__dynamic_cast(CONCAT44(extraout_var_00,iVar2),&IRNode::typeinfo,
                                            &Stmt::typeinfo);
        if (stmt_local == (Stmt *)0x0) {
          pSVar4 = (StmtException *)__cxa_allocate_exception(0x10);
          local_88._0_8_ = local_88 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_88,"Non statement in statement block","");
          local_b8 = local_48;
          __l._M_len = 1;
          __l._M_array = (iterator)&local_b8;
          std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                    ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                     &stack0xffffffffffffff60,__l,(allocator_type *)((long)&s + 7));
          StmtException::StmtException
                    (pSVar4,(string *)local_88,
                     (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                     &stack0xffffffffffffff60);
          __cxa_throw(pSVar4,&StmtException::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar3 = std::
                _Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)this,&stmt_local);
        if (iVar3.super__Node_iterator_base<std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_false>
            ._M_cur != (__node_type *)0x0) {
          pSVar4 = (StmtException *)__cxa_allocate_exception(0x10);
          local_88._0_8_ = local_88 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_88,"Duplicated statement detected","");
          local_b8 = local_48;
          local_b0 = stmt_local;
          __l_00._M_len = 2;
          __l_00._M_array = (iterator)&local_b8;
          std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                    ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                     &stack0xffffffffffffff60,__l_00,(allocator_type *)((long)&s + 7));
          StmtException::StmtException
                    (pSVar4,(string *)local_88,
                     (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                     &stack0xffffffffffffff60);
          __cxa_throw(pSVar4,&StmtException::typeinfo,std::runtime_error::~runtime_error);
        }
        local_88._8_8_ = stmt_local;
        _Stack_70._M_parent = (_Base_ptr)0x0;
        local_88._16_8_ = 0;
        _Stack_70._M_color = _S_red;
        _Stack_70._4_4_ = 0;
        _Stack_70._M_left = &_Stack_70;
        local_50 = 0;
        local_88._0_8_ = pcVar5;
        _Stack_70._M_right = _Stack_70._M_left;
        std::
        _Hashtable<kratos::Stmt*,std::pair<kratos::Stmt*const,kratos::StmtNode>,std::allocator<std::pair<kratos::Stmt*const,kratos::StmtNode>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt*>,std::hash<kratos::Stmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<kratos::Stmt*&,kratos::StmtNode&>
                  ((_Hashtable<kratos::Stmt*,std::pair<kratos::Stmt*const,kratos::StmtNode>,std::allocator<std::pair<kratos::Stmt*const,kratos::StmtNode>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt*>,std::hash<kratos::Stmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)this,&stmt_local,local_88);
        iVar3 = std::
                _Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)this,&stmt_local);
        if (iVar3.super__Node_iterator_base<std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_false>
            ._M_cur == (__node_type *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
        }
        local_a0 = (StmtNode *)
                   ((long)iVar3.
                          super__Node_iterator_base<std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_false>
                          ._M_cur + 0x10);
        if (pcVar5 != (pointer)0x0) {
          std::
          _Rb_tree<kratos::StmtNode*,kratos::StmtNode*,std::_Identity<kratos::StmtNode*>,std::less<kratos::StmtNode*>,std::allocator<kratos::StmtNode*>>
          ::_M_emplace_unique<kratos::StmtNode*&>(local_a8,&stack0xffffffffffffff60);
        }
        add_stmt_child(this,stmt_local);
        std::
        _Rb_tree<kratos::StmtNode_*,_kratos::StmtNode_*,_std::_Identity<kratos::StmtNode_*>,_std::less<kratos::StmtNode_*>,_std::allocator<kratos::StmtNode_*>_>
        ::~_Rb_tree((_Rb_tree<kratos::StmtNode_*,_kratos::StmtNode_*,_std::_Identity<kratos::StmtNode_*>,_std::less<kratos::StmtNode_*>,_std::allocator<kratos::StmtNode_*>_>
                     *)(local_88 + 0x10));
      }
      lVar6 = lVar6 + 1;
    } while (CONCAT44(extraout_var,iVar1) != lVar6);
  }
  return;
}

Assistant:

void StatementGraph::add_stmt_child(Stmt *stmt) {
    auto child_count = stmt->child_count();
    StmtNode *parent_node;
    if (nodes_.find(stmt) == nodes_.end())
        parent_node = nullptr;
    else
        parent_node = &nodes_.at(stmt);
    for (uint64_t i = 0; i < child_count; i++) {
        auto *ir_node = stmt->get_child(i);
        if (ir_node->ir_node_kind() != IRNodeKind::StmtKind) continue;
        auto *s = dynamic_cast<Stmt *>(ir_node);
        if (!s) throw StmtException("Non statement in statement block", {stmt});
        if (nodes_.find(s) != nodes_.end())
            throw StmtException("Duplicated statement detected", {stmt, s});
        StmtNode node_value{parent_node, s, {}};
        nodes_.emplace(s, node_value);
        auto *node = &nodes_.at(s);
        if (parent_node) parent_node->children.emplace(node);
        add_stmt_child(s);
    }
}